

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O1

void __thiscall
HoldingProperty_MoveTo_Test::~HoldingProperty_MoveTo_Test(HoldingProperty_MoveTo_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HoldingProperty, MoveTo)
{
  HoldingMovableType obj;
  Movable move_from;
  auto remembered_value = move_from.getId();
  obj.value1 = std::move( move_from );
  EXPECT_EQ( remembered_value, obj.value1().getId() );
  EXPECT_EQ( 0, move_from.getId() );
  
  IdHolder move_from_other;
  remembered_value = move_from_other.id;
  obj.value1 = std::move( move_from_other );
  EXPECT_EQ( remembered_value, obj.value1().getId() );
  EXPECT_EQ( 0, move_from_other.id );
}